

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_LoadZNodes(FileReader *dalump,DWORD id)

{
  int iStack_10a0;
  FileReaderZ data;
  
  if (id == 0x324c4758) {
    iStack_10a0 = 2;
LAB_004465c0:
    LoadZNodes(&dalump->super_FileReaderBase,iStack_10a0);
    return;
  }
  if (id == 0x324c475a) {
    iStack_10a0 = 2;
  }
  else {
    if (id == 0x334c4758) {
      iStack_10a0 = 3;
      goto LAB_004465c0;
    }
    if (id == 0x334c475a) {
      iStack_10a0 = 3;
    }
    else {
      iStack_10a0 = 0;
      if (id == 0x444f4e58) goto LAB_004465c0;
      if (id != 0x444f4e5a) {
        if (id == 0x4e4c4758) {
          iStack_10a0 = 1;
          goto LAB_004465c0;
        }
        if (id != 0x4e4c475a) {
          return;
        }
        iStack_10a0 = 1;
      }
    }
  }
  FileReaderZ::FileReaderZ(&data,dalump,false);
  LoadZNodes(&data.super_FileReaderBase,iStack_10a0);
  FileReaderZ::~FileReaderZ(&data);
  return;
}

Assistant:

void P_LoadZNodes (FileReader &dalump, DWORD id)
{
	int type;
	bool compressed;

	switch (id)
	{
	case MAKE_ID('Z','N','O','D'):
		type = 0;
		compressed = true;
		break;

	case MAKE_ID('Z','G','L','N'):
		type = 1;
		compressed = true;
		break;

	case MAKE_ID('Z','G','L','2'):
		type = 2;
		compressed = true;
		break;

	case MAKE_ID('Z','G','L','3'):
		type = 3;
		compressed = true;
		break;

	case MAKE_ID('X','N','O','D'):
		type = 0;
		compressed = false;
		break;

	case MAKE_ID('X','G','L','N'):
		type = 1;
		compressed = false;
		break;

	case MAKE_ID('X','G','L','2'):
		type = 2;
		compressed = false;
		break;

	case MAKE_ID('X','G','L','3'):
		type = 3;
		compressed = false;
		break;

	default:
		return;
	}
	
	if (compressed)
	{
		FileReaderZ data (dalump);
		LoadZNodes(data, type);
	}
	else
	{
		LoadZNodes(dalump, type);
	}
}